

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  undefined4 uVar1;
  FileDescriptorProto *parent;
  bool bVar2;
  int iVar3;
  int iVar4;
  Token *pTVar5;
  DescriptorProto_ExtensionRange *pDVar6;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_00;
  SourceCodeInfo_Location *pSVar7;
  string_view local_268;
  SourceCodeInfo_Location *local_258;
  SourceCodeInfo_Location *dest;
  int local_248;
  int j;
  int i_1;
  int i;
  string_view local_230;
  string_view local_220;
  undefined1 local_210 [8];
  LocationRecorder location_1;
  LocationRecorder index_location;
  ExtensionRangeOptions *options;
  SourceCodeInfo info;
  undefined1 auStack_188 [4];
  int range_number_index;
  string_view local_178;
  undefined1 local_168 [8];
  LocationRecorder end_location_1;
  ErrorMaker local_140;
  string_view local_130;
  undefined1 local_120 [8];
  LocationRecorder end_location;
  ErrorMaker local_f8;
  int local_e4;
  ErrorMaker local_e0;
  undefined1 local_d0 [8];
  LocationRecorder start_location;
  Token start_token;
  int local_78;
  int end;
  int start;
  DescriptorProto_ExtensionRange *local_68;
  ExtensionRange *range;
  LocationRecorder location;
  undefined1 auStack_40 [4];
  int old_range_size;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *extensions_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)extensions_location;
  extensions_location_local = (LocationRecorder *)message;
  message_local = (DescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_40,"extensions");
  bVar2 = Consume(this,_auStack_40);
  if (bVar2) {
    location.location_._4_4_ =
         DescriptorProto::extension_range_size((DescriptorProto *)extensions_location_local);
    do {
      parent = containing_file_local;
      iVar3 = DescriptorProto::extension_range_size((DescriptorProto *)extensions_location_local);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&range,(LocationRecorder *)parent,iVar3);
      local_68 = DescriptorProto::add_extension_range((DescriptorProto *)extensions_location_local);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)&range,&local_68->super_Message,NUMBER);
      io::Tokenizer::Token::Token((Token *)&start_location.location_);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_d0,(LocationRecorder *)&range,1);
      pTVar5 = io::Tokenizer::current(this->input_);
      io::Tokenizer::Token::operator=((Token *)&start_location.location_,pTVar5);
      ErrorMaker::ErrorMaker(&local_e0,"Expected field number range.");
      bVar2 = ConsumeInteger(this,&local_78,local_e0);
      iVar3 = local_78;
      if (bVar2) {
        iVar4 = std::numeric_limits<int>::max();
        if (iVar3 == iVar4) {
          ErrorMaker::ErrorMaker(&local_f8,"Field number out of bounds.");
          RecordError(this,local_f8);
          this_local._7_1_ = 0;
          local_e4 = 1;
        }
        else {
          local_e4 = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_e4 = 1;
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_d0);
      if (local_e4 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&end_location.location_,"to")
        ;
        bVar2 = TryConsume(this,stack0xfffffffffffffef8);
        if (bVar2) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_120,(LocationRecorder *)&range,2);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"max")
          ;
          bVar2 = TryConsume(this,local_130);
          if (bVar2) {
            start_token._52_4_ = 0xfffffffe;
LAB_0059cb22:
            local_e4 = 0;
          }
          else {
            ErrorMaker::ErrorMaker(&local_140,"Expected integer.");
            bVar2 = ConsumeInteger(this,(int *)&start_token.field_0x34,local_140);
            uVar1 = start_token._52_4_;
            if (bVar2) {
              iVar3 = std::numeric_limits<int>::max();
              if (uVar1 != iVar3) goto LAB_0059cb22;
              ErrorMaker::ErrorMaker
                        ((ErrorMaker *)&end_location_1.location_,"Field number out of bounds.");
              RecordError(this,stack0xfffffffffffffeb0);
              this_local._7_1_ = 0;
              local_e4 = 1;
            }
            else {
              this_local._7_1_ = 0;
              local_e4 = 1;
            }
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_120);
          if (local_e4 != 0) goto LAB_0059cbea;
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_168,(LocationRecorder *)&range,2);
          LocationRecorder::StartAt
                    ((LocationRecorder *)local_168,(Token *)&start_location.location_);
          LocationRecorder::EndAt((LocationRecorder *)local_168,(Token *)&start_location.location_);
          start_token._52_4_ = local_78;
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_168);
        }
        start_token._52_4_ = start_token._52_4_ + 1;
        DescriptorProto_ExtensionRange::set_start(local_68,local_78);
        DescriptorProto_ExtensionRange::set_end(local_68,start_token._52_4_);
        local_e4 = 0;
      }
LAB_0059cbea:
      io::Tokenizer::Token::~Token((Token *)&start_location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&range);
      if (local_e4 != 0) goto LAB_0059d14c;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,",");
      bVar2 = TryConsume(this,local_178);
    } while (bVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188,"[");
    bVar2 = LookingAt(this,_auStack_188);
    if (bVar2) {
      info.field_0._52_4_ =
           LocationRecorder::CurrentPathSize((LocationRecorder *)containing_file_local);
      SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&options);
      pDVar6 = DescriptorProto::mutable_extension_range
                         ((DescriptorProto *)extensions_location_local,location.location_._4_4_);
      from = DescriptorProto_ExtensionRange::mutable_options(pDVar6);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&location_1.location_,(LocationRecorder *)containing_file_local
                 ,0,(SourceCodeInfo *)&options);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_210,(LocationRecorder *)&location_1.location_,3);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_220,"[");
      bVar2 = Consume(this,local_220);
      if (bVar2) {
        do {
          bVar2 = ParseOption(this,&from->super_Message,(LocationRecorder *)local_210,local_30,
                              OPTION_ASSIGNMENT);
          if (!bVar2) {
            this_local._7_1_ = 0;
            local_e4 = 1;
            goto LAB_0059cea4;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,",");
          bVar2 = TryConsume(this,local_230);
        } while (bVar2);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&i_1,"]");
        bVar2 = Consume(this,_i_1);
        if (bVar2) {
          local_e4 = 0;
        }
        else {
          this_local._7_1_ = 0;
          local_e4 = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_e4 = 1;
      }
LAB_0059cea4:
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_210);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&location_1.location_);
      iVar3 = location.location_._4_4_;
      if (local_e4 == 0) {
        while( true ) {
          j = iVar3 + 1;
          iVar3 = j;
          iVar4 = DescriptorProto::extension_range_size
                            ((DescriptorProto *)extensions_location_local);
          if (iVar4 <= iVar3) break;
          pDVar6 = DescriptorProto::mutable_extension_range
                             ((DescriptorProto *)extensions_location_local,j);
          this_00 = DescriptorProto_ExtensionRange::mutable_options(pDVar6);
          ExtensionRangeOptions::operator=(this_00,from);
          iVar3 = j;
        }
        for (local_248 = location.location_._4_4_; iVar3 = local_248,
            iVar4 = DescriptorProto::extension_range_size
                              ((DescriptorProto *)extensions_location_local), iVar3 < iVar4;
            local_248 = local_248 + 1) {
          for (dest._4_4_ = 0; iVar3 = dest._4_4_,
              iVar4 = SourceCodeInfo::location_size((SourceCodeInfo *)&options), iVar3 < iVar4;
              dest._4_4_ = dest._4_4_ + 1) {
            pSVar7 = SourceCodeInfo::location((SourceCodeInfo *)&options,dest._4_4_);
            iVar3 = SourceCodeInfo_Location::path_size(pSVar7);
            if (iVar3 != info.field_0._52_4_ + 1) {
              local_258 = SourceCodeInfo::add_location(this->source_code_info_);
              pSVar7 = SourceCodeInfo::location((SourceCodeInfo *)&options,dest._4_4_);
              SourceCodeInfo_Location::operator=(local_258,pSVar7);
              SourceCodeInfo_Location::set_path(local_258,info.field_0._52_4_,local_248);
            }
          }
        }
        local_e4 = 0;
      }
      SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&options);
      if (local_e4 != 0) goto LAB_0059d14c;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,";");
    bVar2 = ConsumeEndOfDeclaration(this,local_268,(LocationRecorder *)containing_file_local);
    if (bVar2) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0059d14c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));

      if (start == std::numeric_limits<int>::max()) {
        RecordError("Field number out of bounds.");
        return false;
      }
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));

        if (end == std::numeric_limits<int>::max()) {
          RecordError("Field number out of bounds.");
          return false;
        }
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      *message->mutable_extension_range(i)->mutable_options() = *options;
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}